

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O2

void __thiscall kpeg::MCU::performLevelShift(MCU *this)

{
  Level LVar1;
  Logger *pLVar2;
  ostream *poVar3;
  Level lvl;
  Level lvl_00;
  array<std::array<std::array<float,_8UL>,_8UL>,_3UL> *paVar4;
  int y;
  long lVar5;
  int x;
  long lVar6;
  int i;
  long lVar7;
  array<std::array<std::array<float,_8UL>,_8UL>,_3UL> *paVar8;
  float fVar9;
  string local_48;
  
  pLVar2 = Logger::get();
  LVar1 = Logger::getLevel(pLVar2);
  if (1 < (int)LVar1) {
    pLVar2 = Logger::get();
    poVar3 = Logger::getStream(pLVar2);
    Logger::levelStr_abi_cxx11_(&local_48,(Logger *)0x2,lvl);
    poVar3 = std::operator<<(poVar3,(string *)&local_48);
    poVar3 = std::operator<<(poVar3,"[ kpeg:");
    poVar3 = std::operator<<(poVar3,"MCU.cpp");
    poVar3 = std::operator<<(poVar3,":");
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xdc);
    poVar3 = std::operator<<(poVar3," ] ");
    poVar3 = std::operator<<(poVar3,"Performing level shift on MCU: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,m_MCUCount);
    poVar3 = std::operator<<(poVar3,"...");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_48);
  }
  paVar4 = &this->icoeffs;
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    paVar8 = paVar4;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        fVar9 = roundf(paVar8->_M_elems[0]._M_elems[0]._M_elems[lVar6]);
        (((MCU *)(paVar8 + -1))->m_8x8block)._M_elems[0]._M_elems[0]._M_elems[lVar6] =
             (int)ROUND(fVar9 + 128.0);
      }
      paVar8 = (array<std::array<std::array<float,_8UL>,_8UL>,_3UL> *)
               (paVar8->_M_elems[0]._M_elems + 1);
    }
    paVar4 = (array<std::array<std::array<float,_8UL>,_8UL>,_3UL> *)(paVar4->_M_elems + 1);
  }
  pLVar2 = Logger::get();
  LVar1 = Logger::getLevel(pLVar2);
  if (1 < (int)LVar1) {
    pLVar2 = Logger::get();
    poVar3 = Logger::getStream(pLVar2);
    Logger::levelStr_abi_cxx11_(&local_48,(Logger *)0x2,lvl_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_48);
    poVar3 = std::operator<<(poVar3,"[ kpeg:");
    poVar3 = std::operator<<(poVar3,"MCU.cpp");
    poVar3 = std::operator<<(poVar3,":");
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf4);
    poVar3 = std::operator<<(poVar3," ] ");
    poVar3 = std::operator<<(poVar3,"Level shift on MCU: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,m_MCUCount);
    poVar3 = std::operator<<(poVar3," complete [OK]");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void MCU::performLevelShift()
    {
        LOG(Logger::Level::DEBUG) << "Performing level shift on MCU: " << m_MCUCount << "..." << std::endl;
        
        for ( int i = 0; i <3; ++i )
        {
            for ( int y = 0; y < 8; ++y )
            {
                for ( int x = 0; x < 8; ++x )
                {
                    m_8x8block[i][y][x] = std::roundl( icoeffs[i][y][x] ) + 128;
                }
            }
        }
        
//         for (auto&& mat: m_8x8block )
//         {
//             for ( auto&& row : mat )
//             {
//                 for ( auto&& v : row )
//                     std::cout << v << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;
//         }
        
        LOG(Logger::Level::DEBUG) << "Level shift on MCU: " << m_MCUCount << " complete [OK]" << std::endl;
    }